

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O2

QGraphicsWidgetPrivate * __thiscall
QGraphicsWidgetPrivate::naturalWidgetFont(QGraphicsWidgetPrivate *this)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  QGraphicsWidget *pQVar3;
  long in_RSI;
  long lVar4;
  long in_FS_OFFSET;
  _func_int **local_30;
  undefined4 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(in_RSI + 0x170) + -0x10;
  if (*(long *)(in_RSI + 0x170) == 0) {
    lVar4 = 0;
  }
  (this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  (this->super_QGraphicsItemPrivate).extras.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)this);
  pQVar3 = QGraphicsItem::parentWidget((QGraphicsItem *)(lVar4 + 0x10));
  if (pQVar3 == (QGraphicsWidget *)0x0) {
    if (*(long *)(in_RSI + 0x88) == 0) goto LAB_005ca1b0;
    QGraphicsScene::font((QGraphicsScene *)&local_30);
  }
  else {
    QGraphicsWidget::font((QGraphicsWidget *)&local_30);
  }
  pp_Var2 = (this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate;
  (this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate = local_30;
  uVar1 = *(undefined4 *)&(this->super_QGraphicsItemPrivate).extras.d.d;
  *(undefined4 *)&(this->super_QGraphicsItemPrivate).extras.d.d = local_28;
  local_30 = pp_Var2;
  local_28 = uVar1;
  QFont::~QFont((QFont *)&local_30);
LAB_005ca1b0:
  *(undefined4 *)&(this->super_QGraphicsItemPrivate).extras.d.d = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFont QGraphicsWidgetPrivate::naturalWidgetFont() const
{
    Q_Q(const QGraphicsWidget);
    QFont naturalFont; // ### no application font support
    if (QGraphicsWidget *parent = q->parentWidget()) {
        naturalFont = parent->font();
    } else if (scene) {
        naturalFont = scene->font();
    }
    naturalFont.setResolveMask(0);
    return naturalFont;
}